

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_TwoLevelShm_Async.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP5Writer::WriteData_TwoLevelShm_Async(BP5Writer *this,BufferV *Data)

{
  Comm *this_00;
  Comm *this_01;
  AsyncWriteInfo **ppAVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  unsigned_long uVar5;
  pointer pCVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Alloc_hider _Var7;
  size_type sVar8;
  int iVar9;
  int iVar10;
  uint64_t uVar11;
  pointer puVar12;
  uint64_t uVar13;
  AsyncWriteInfo *pAVar14;
  TokenChain<unsigned_long> *this_03;
  uint64_t uVar15;
  unsigned_long *puVar16;
  size_t alignment_size;
  uint64_t *puVar17;
  ulong blocksize;
  uint64_t nextWriterPos_2;
  uint64_t nextWriterPos;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mySizes;
  string local_a8;
  MPIShmChain *local_88;
  uint64_t *local_80;
  BufferV *local_78;
  Comm local_70;
  Comm local_68;
  Status local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (this->m_Aggregator == (MPIAggregator *)0x0) {
    local_88 = (MPIShmChain *)0x0;
  }
  else {
    local_88 = (MPIShmChain *)
               __dynamic_cast(this->m_Aggregator,&aggregator::MPIAggregator::typeinfo,
                              &aggregator::MPIShmChain::typeinfo);
  }
  uVar11 = helper::PaddingToAlignOffset
                     (this->m_DataPos,(ulong)(this->super_BP5Engine).m_Parameters.StripeSize);
  this->m_DataPos = this->m_DataPos + uVar11;
  this_00 = &(local_88->super_MPIAggregator).m_Comm;
  local_78 = Data;
  uVar11 = adios2::format::BufferV::Size(Data);
  blocksize = 0;
  helper::Comm::GatherValues<unsigned_long>(&local_48,this_00,uVar11,0);
  uVar11 = 0;
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    blocksize = 0;
    puVar12 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar4 = *puVar12;
      uVar11 = uVar11 + uVar4;
      if (blocksize < uVar4) {
        blocksize = uVar4;
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 !=
             local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar9 = helper::Comm::Size(this_00);
  if (1 < iVar9) {
    alignment_size = 0x20;
    if ((this->super_BP5Engine).m_Parameters.DirectIO != false) {
      alignment_size = (ulong)(this->super_BP5Engine).m_Parameters.DirectIOAlignOffset;
    }
    aggregator::MPIShmChain::CreateShm
              (local_88,blocksize,(this->super_BP5Engine).m_Parameters.MaxShmSize,alignment_size);
  }
  if ((local_88->super_MPIAggregator).m_IsAggregator != true) goto LAB_00485bd3;
  this_01 = &local_88->m_AggregatorChainComm;
  iVar9 = helper::Comm::Rank(this_01);
  puVar17 = &this->m_DataPos;
  local_80 = puVar17;
  if (iVar9 < 1) {
    uVar13 = *puVar17;
  }
  else {
    iVar9 = helper::Comm::Rank(this_01);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"AggregatorChain token in BP5Writer::WriteData_TwoLevelShm","");
    puVar17 = local_80;
    helper::Comm::Recv<unsigned_long>(&local_60,this_01,local_80,1,iVar9 + -1,0,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    uVar13 = helper::PaddingToAlignOffset
                       (this->m_DataPos,(ulong)(this->super_BP5Engine).m_Parameters.StripeSize);
    uVar13 = uVar13 + *puVar17;
    *puVar17 = uVar13;
  }
  this->m_StartDataPos = uVar13;
  iVar9 = helper::Comm::Rank(this_01);
  iVar10 = helper::Comm::Size(this_01);
  if (iVar9 < iVar10 + -1) {
    local_60._0_8_ = *puVar17 + uVar11;
    iVar9 = helper::Comm::Rank(this_01);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Chain token in BP5Writer::WriteData","");
    helper::Comm::Isend<unsigned_long>
              (&local_68,(unsigned_long *)this_01,(size_t)&local_60,1,iVar9 + 1,(string *)0x0);
    helper::Comm::Req::~Req((Req *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
LAB_00485b37:
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  else {
    iVar9 = helper::Comm::Size(this_01);
    if (1 < iVar9) {
      local_60._0_8_ = *puVar17 + uVar11;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Chain token in BP5Writer::WriteData","");
      helper::Comm::Isend<unsigned_long>
                (&local_70,(unsigned_long *)this_01,(size_t)&local_60,1,0,(string *)0x0);
      helper::Comm::Req::~Req((Req *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) goto LAB_00485b37;
    }
  }
  iVar9 = helper::Comm::Rank(this_01);
  if (iVar9 == 0) {
    iVar9 = helper::Comm::Size(this_01);
    if (iVar9 < 2) {
      this->m_DataPos = this->m_StartDataPos + uVar11;
    }
    else {
      iVar9 = helper::Comm::Size(this_01);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Chain token in BP5Writer::WriteData","");
      helper::Comm::Recv<unsigned_long>(&local_60,this_01,local_80,1,iVar9 + -1,0,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
  }
LAB_00485bd3:
  pAVar14 = (AsyncWriteInfo *)operator_new(0xa0);
  memset(pAVar14,0,0xa0);
  helper::Comm::Comm(&pAVar14->comm_chain);
  (pAVar14->tstart).__d.__r = 0.0;
  (pAVar14->expectedComputationBlocks).
  super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar14->expectedComputationBlocks).
  super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar14->expectedComputationBlocks).
  super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_AsyncWriteInfo = pAVar14;
  pAVar14->aggregator = this->m_Aggregator;
  iVar9 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  ppAVar1 = &this->m_AsyncWriteInfo;
  (*ppAVar1)->rank_global = iVar9;
  iVar9 = helper::Comm::Rank(this_00);
  (*ppAVar1)->rank_chain = iVar9;
  iVar9 = helper::Comm::Size(this_00);
  (*ppAVar1)->nproc_chain = iVar9;
  helper::Comm::Comm((Comm *)&local_a8);
  helper::Comm::operator=(&(*ppAVar1)->comm_chain,(Comm *)&local_a8);
  helper::Comm::~Comm((Comm *)&local_a8);
  (this->m_AsyncWriteInfo->tstart).__d.__r = (this->m_EngineStart).__d.__r;
  this_03 = (TokenChain<unsigned_long> *)operator_new(0x20);
  shm::TokenChain<unsigned_long>::TokenChain(this_03,this_00);
  pAVar14 = this->m_AsyncWriteInfo;
  pAVar14->tokenChain = this_03;
  pAVar14->tm = &this->m_FileDataManager;
  pAVar14->Data = local_78;
  pAVar14->flagRush = &this->m_flagRush;
  pAVar14->lock = &this->m_AsyncWriteLock;
  if ((local_88->super_MPIAggregator).m_IsAggregator == true) {
    uVar13 = this->m_StartDataPos;
    uVar15 = adios2::format::BufferV::Size(local_78);
    local_a8._M_dataplus._M_p = (pointer)(uVar15 + uVar13);
    shm::TokenChain<unsigned_long>::SendToken
              (this->m_AsyncWriteInfo->tokenChain,(unsigned_long *)&local_a8);
    shm::TokenChain<unsigned_long>::RecvToken((*ppAVar1)->tokenChain);
  }
  else {
    puVar16 = shm::TokenChain<unsigned_long>::RecvToken(this_03);
    uVar5 = *puVar16;
    this->m_StartDataPos = uVar5;
    uVar13 = adios2::format::BufferV::Size(local_78);
    local_a8._M_dataplus._M_p = (pointer)(uVar13 + uVar5);
    shm::TokenChain<unsigned_long>::SendToken
              (this->m_AsyncWriteInfo->tokenChain,(unsigned_long *)&local_a8);
  }
  pAVar14 = this->m_AsyncWriteInfo;
  pAVar14->startPos = this->m_StartDataPos;
  pAVar14->totalSize = uVar11;
  dVar2 = (this->m_ExpectedTimeBetweenSteps).__r;
  pAVar14->deadline = dVar2;
  dVar3 = this->m_ComputationBlocksLength;
  iVar9 = (this->super_BP5Engine).m_Parameters.AsyncWrite;
  if (iVar9 != 2 || dVar3 <= 0.0) {
    if (iVar9 == 1) {
      pAVar14->deadline = 0.0;
    }
    pAVar14->inComputationBlock = (bool *)0x0;
    pAVar14->computationBlocksLength = 0.0;
    pAVar14->currentComputationBlocks =
         (vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
          *)0x0;
    pAVar14->currentComputationBlockID = (size_t *)0x0;
  }
  else {
    pAVar14->inComputationBlock = &this->m_InComputationBlock;
    pAVar14->computationBlocksLength = dVar3;
    if (dVar2 < dVar3) {
      pAVar14->deadline = dVar3;
    }
    std::
    vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
    ::operator=(&pAVar14->expectedComputationBlocks,&this->m_ComputationBlockTimes);
    pAVar14 = this->m_AsyncWriteInfo;
    pAVar14->currentComputationBlocks = &this->m_ComputationBlockTimes;
    pAVar14->currentComputationBlockID = &this->m_ComputationBlockID;
    pCVar6 = (this->m_ComputationBlockTimes).
             super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_ComputationBlockTimes).
        super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish != pCVar6) {
      (this->m_ComputationBlockTimes).
      super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = pCVar6;
    }
    this->m_ComputationBlocksLength = 0.0;
    this->m_ComputationBlockID = 0;
  }
  std::
  async<int(&)(adios2::core::engine::BP5Writer::AsyncWriteInfo*),adios2::core::engine::BP5Writer::AsyncWriteInfo*&>
            ((launch)&local_a8,(_func_int_AsyncWriteInfo_ptr *)0x1,
             (AsyncWriteInfo **)AsyncWriteThread_TwoLevelShm);
  sVar8 = local_a8._M_string_length;
  _Var7._M_p = local_a8._M_dataplus._M_p;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  this_02 = (this->m_WriteFuture).super___basic_future<int>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_WriteFuture).super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var7._M_p;
  (this->m_WriteFuture).super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar8;
  if ((this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BP5Writer::WriteData_TwoLevelShm_Async(format::BufferV *Data)
{
    aggregator::MPIShmChain *a = dynamic_cast<aggregator::MPIShmChain *>(m_Aggregator);

    // new step writing starts at offset m_DataPos on master aggregator
    // other aggregators to the same file will need to wait for the position
    // to arrive from the rank below

    // align to PAGE_SIZE (only valid on master aggregator at this point)
    m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);

    // Each aggregator needs to know the total size they write
    // This calculation is valid on aggregators only
    std::vector<uint64_t> mySizes = a->m_Comm.GatherValues(Data->Size());
    uint64_t myTotalSize = 0;
    uint64_t maxSize = 0;
    for (auto s : mySizes)
    {
        myTotalSize += s;
        if (s > maxSize)
        {
            maxSize = s;
        }
    }

    if (a->m_Comm.Size() > 1)
    {
        size_t alignment_size = sizeof(max_align_t);
        if (m_Parameters.DirectIO)
        {
            alignment_size = m_Parameters.DirectIOAlignOffset;
        }
        a->CreateShm(static_cast<size_t>(maxSize), m_Parameters.MaxShmSize, alignment_size);
    }

    if (a->m_IsAggregator)
    {
        // In each aggregator chain, send from master down the line
        // these total sizes, so every aggregator knows where to start
        if (a->m_AggregatorChainComm.Rank() > 0)
        {
            a->m_AggregatorChainComm.Recv(
                &m_DataPos, 1, a->m_AggregatorChainComm.Rank() - 1, 0,
                "AggregatorChain token in BP5Writer::WriteData_TwoLevelShm");
            // align to PAGE_SIZE
            m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);
        }
        m_StartDataPos = m_DataPos; // metadata needs this info
        if (a->m_AggregatorChainComm.Rank() < a->m_AggregatorChainComm.Size() - 1)
        {
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, a->m_AggregatorChainComm.Rank() + 1,
                                           0, "Chain token in BP5Writer::WriteData");
        }
        else if (a->m_AggregatorChainComm.Size() > 1)
        {
            // send back final position from last aggregator in file to master
            // aggregator
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, 0, 0,
                                           "Chain token in BP5Writer::WriteData");
        }

        // Master aggregator needs to know where the last writing ended by the
        // last aggregator in the chain, so that it can start from the correct
        // position at the next output step
        if (!a->m_AggregatorChainComm.Rank())
        {
            if (a->m_AggregatorChainComm.Size() > 1)
            {
                a->m_AggregatorChainComm.Recv(&m_DataPos, 1, a->m_AggregatorChainComm.Size() - 1, 0,
                                              "Chain token in BP5Writer::WriteData");
            }
            else
            {
                m_DataPos = m_StartDataPos + myTotalSize;
            }
        }
    }

    /*std::cout << "Rank " << m_Comm.Rank() << "  start data async "
              << " to subfile " << a->m_SubStreamIndex << " at pos "
              << m_StartDataPos << std::endl;*/

    m_AsyncWriteInfo = new AsyncWriteInfo();
    m_AsyncWriteInfo->aggregator = m_Aggregator;
    m_AsyncWriteInfo->rank_global = m_Comm.Rank();
    m_AsyncWriteInfo->rank_chain = a->m_Comm.Rank();
    m_AsyncWriteInfo->nproc_chain = a->m_Comm.Size();
    m_AsyncWriteInfo->comm_chain = helper::Comm(); // unused in this aggregation
    m_AsyncWriteInfo->tstart = m_EngineStart;
    m_AsyncWriteInfo->tokenChain = new shm::TokenChain<uint64_t>(&a->m_Comm);
    m_AsyncWriteInfo->tm = &m_FileDataManager;
    m_AsyncWriteInfo->Data = Data;
    m_AsyncWriteInfo->flagRush = &m_flagRush;
    m_AsyncWriteInfo->lock = &m_AsyncWriteLock;

    // Metadata collection needs m_StartDataPos correctly set on
    // every process before we call the async writing thread
    if (a->m_IsAggregator)
    {
        // Informs next process its starting offset (for correct metadata)
        uint64_t nextWriterPos = m_StartDataPos + Data->Size();
        m_AsyncWriteInfo->tokenChain->SendToken(nextWriterPos);
        m_AsyncWriteInfo->tokenChain->RecvToken();
    }
    else
    {
        // non-aggregators fill shared buffer in marching order
        // they also receive their starting offset this way
        m_StartDataPos = m_AsyncWriteInfo->tokenChain->RecvToken();
        uint64_t nextWriterPos = m_StartDataPos + Data->Size();
        m_AsyncWriteInfo->tokenChain->SendToken(nextWriterPos);
    }

    // Launch data writing thread, m_StartDataPos is valid
    // m_DataPos is already pointing to the end of the write, do not use here.
    m_AsyncWriteInfo->startPos = m_StartDataPos;
    m_AsyncWriteInfo->totalSize = myTotalSize;
    m_AsyncWriteInfo->deadline = m_ExpectedTimeBetweenSteps.count();

    if (m_ComputationBlocksLength > 0.0 && m_Parameters.AsyncWrite == (int)AsyncWrite::Guided)
    {
        m_AsyncWriteInfo->inComputationBlock = &m_InComputationBlock;
        m_AsyncWriteInfo->computationBlocksLength = m_ComputationBlocksLength;
        if (m_AsyncWriteInfo->deadline < m_ComputationBlocksLength)
        {
            m_AsyncWriteInfo->deadline = m_ComputationBlocksLength;
        }
        m_AsyncWriteInfo->expectedComputationBlocks = m_ComputationBlockTimes; // copy!
        m_AsyncWriteInfo->currentComputationBlocks = &m_ComputationBlockTimes; // ptr!
        m_AsyncWriteInfo->currentComputationBlockID = &m_ComputationBlockID;

        /* Clear current block tracker now so that async thread does not get
        confused with the past info */
        m_ComputationBlockTimes.clear();
        m_ComputationBlocksLength = 0.0;
        m_ComputationBlockID = 0;
    }
    else
    {
        if (m_Parameters.AsyncWrite == (int)AsyncWrite::Naive)
        {
            m_AsyncWriteInfo->deadline = 0;
        }
        m_AsyncWriteInfo->inComputationBlock = nullptr;
        m_AsyncWriteInfo->computationBlocksLength = 0.0;
        m_AsyncWriteInfo->currentComputationBlocks = nullptr;
        m_AsyncWriteInfo->currentComputationBlockID = nullptr;
    }

    m_WriteFuture = std::async(std::launch::async, AsyncWriteThread_TwoLevelShm, m_AsyncWriteInfo);

    /* At this point it is prohibited in the main thread
       - to modify Data, which will be deleted in the async thread any tiume
       - to use m_FileDataManager until next BeginStep, which is being used
         in the async thread to write data
    */
}